

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChParserOpenSim::Parse(ChParserOpenSim *this,ChSystem *system,string *filename)

{
  double dVar1;
  double dVar2;
  xml_node<char> *pxVar3;
  xml_node<char> *pxVar4;
  ostream *poVar5;
  char *pcVar6;
  shared_ptr<chrono::ChLoadContainer> loadcontainer;
  vector<double,_std::allocator<double>_> elems;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> a_Stack_10160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10158;
  file<char> file;
  __shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2> _Stack_10130;
  string sStack_10120;
  string sStack_10100;
  path filepath;
  xml_document<char> doc;
  
  filesystem::path::path(&filepath,filename);
  filesystem::path::parent_path((path *)&doc,&filepath);
  filesystem::path::str_abi_cxx11_(&sStack_10100,(path *)&doc,native_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loadcontainer
                 ,&sStack_10100,"/");
  filesystem::path::stem_abi_cxx11_(&sStack_10120,&filepath);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elems,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loadcontainer
                 ,&sStack_10120);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elems,"/");
  std::__cxx11::string::operator=((string *)&this->m_datapath,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&elems);
  std::__cxx11::string::~string((string *)&sStack_10120);
  std::__cxx11::string::~string((string *)&loadcontainer);
  std::__cxx11::string::~string((string *)&sStack_10100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&doc.super_xml_node<char>.super_xml_base<char>.m_value);
  rapidxml::file<char>::file(&file,(filename->_M_dataplus)._M_p);
  doc.super_memory_pool<char>.m_end = (char *)&doc.super_memory_pool<char>.m_alloc_func;
  doc.super_memory_pool<char>.m_begin = doc.super_memory_pool<char>.m_static_memory;
  doc.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  doc.super_xml_node<char>.m_type = node_document;
  doc.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  doc.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  doc.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  doc.super_memory_pool<char>.m_ptr = doc.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>
            (&doc,file.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  pxVar3 = rapidxml::xml_node<char>::first_node
                     (doc.super_xml_node<char>.m_first_node,"Model",0,true);
  pxVar3 = rapidxml::xml_node<char>::first_node(pxVar3,"gravity",0,true);
  pcVar6 = (pxVar3->super_xml_base<char>).m_value;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  strToSTLVector<double>(&elems,pcVar6);
  dVar1 = elems.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[2];
  dVar2 = elems.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  (system->G_acc).m_data[0] =
       *elems.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start;
  (system->G_acc).m_data[1] = dVar2;
  (system->G_acc).m_data[2] = dVar1;
  pxVar3 = rapidxml::xml_node<char>::first_node
                     (doc.super_xml_node<char>.m_first_node,"Model",0,true);
  pxVar3 = rapidxml::xml_node<char>::first_node(pxVar3,"BodySet",0,true);
  if (pxVar3 == (xml_node<char> *)0x0) {
    pxVar4 = rapidxml::xml_node<char>::first_node((xml_node<char> *)0x0,"objects",0,true);
    if (pxVar4 != (xml_node<char> *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"No body set detected for this model.");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00e4792e;
    }
  }
  pxVar3 = rapidxml::xml_node<char>::first_node(pxVar3,"objects",0,true);
  for (pxVar3 = pxVar3->m_first_node; pxVar3 != (xml_node<char> *)0x0;
      pxVar3 = rapidxml::xml_node<char>::next_sibling(pxVar3,(char *)0x0,0,true)) {
    parseBody(this,pxVar3,system);
  }
  std::make_shared<chrono::ChLoadContainer>();
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLoadContainer,void>
            (a_Stack_10160,
             &loadcontainer.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChSystem::Add(system,(shared_ptr<chrono::ChPhysicsItem> *)a_Stack_10160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10158);
  pxVar3 = rapidxml::xml_node<char>::first_node
                     (doc.super_xml_node<char>.m_first_node,"Model",0,true);
  pxVar3 = rapidxml::xml_node<char>::first_node(pxVar3,"ForceSet",0,true);
  if (pxVar3 == (xml_node<char> *)0x0) {
LAB_00e478bc:
    pcVar6 = "No forces detected.";
    poVar5 = std::operator<<((ostream *)&std::cout,"No forces detected.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    pxVar4 = rapidxml::xml_node<char>::first_node(pxVar3,"objects",0,true);
    if (pxVar4 == (xml_node<char> *)0x0) goto LAB_00e478bc;
    poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
    rapidxml::xml_node<char>::first_node(pxVar3,"objects",0,true);
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar6 = "objects";
    pxVar3 = rapidxml::xml_node<char>::first_node(pxVar3,"objects",0,true);
    for (pxVar3 = pxVar3->m_first_node; pxVar3 != (xml_node<char> *)0x0;
        pxVar3 = rapidxml::xml_node<char>::next_sibling(pxVar3,(char *)0x0,0,true)) {
      std::__shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&_Stack_10130,
                 &loadcontainer.
                  super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>);
      parseForce(this,pxVar3,system,(shared_ptr<chrono::ChLoadContainer> *)&_Stack_10130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10130._M_refcount);
      pcVar6 = (char *)0x0;
    }
  }
  initShapes(this,(xml_node<char> *)pcVar6,system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&loadcontainer.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_00e4792e:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&elems.super__Vector_base<double,_std::allocator<double>_>);
  rapidxml::memory_pool<char>::~memory_pool(&doc.super_memory_pool<char>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filepath.m_path);
  return;
}

Assistant:

void ChParserOpenSim::Parse(ChSystem& system, const std::string& filename) {
    // Use the model name as the directory for obj files. For example,
    // the osim file opensim/Rajagopal2015.osim should have the referenced obj
    // files sitting in data/opensim/Rajagopal2015/
    // Use filesystem for path parsing, we should probably use the library more
    path filepath(filename);
    // Set the member path so when we load meshes we can find them
    // Strip the parent and stem to use as directory for data files
    m_datapath = filepath.parent_path().str() + "/" + filepath.stem() + "/";

    rapidxml::file<char> file(filename.c_str());

    xml_document<> doc;
    doc.parse<0>(file.data());

    // Get gravity from model and set it in system
    auto elems = strToSTLVector<double>(doc.first_node()->first_node("Model")->first_node("gravity")->value());
    system.Set_G_acc(ChVector<>(elems[0], elems[1], elems[2]));

    // Traverse the list of bodies and parse the information for each one
    xml_node<>* bodySet = doc.first_node()->first_node("Model")->first_node("BodySet");
    if (bodySet == NULL && bodySet->first_node("objects") != NULL) {
        std::cout << "No body set detected for this model." << std::endl;
        return;
    }
    xml_node<>* bodyNode = bodySet->first_node("objects")->first_node();
    while (bodyNode != NULL) {
        parseBody(bodyNode, system);
        bodyNode = bodyNode->next_sibling();
    }

    ////xml_node<>* controllerSet =
    ////    doc.first_node()->first_node("Model")->first_node("ControllerSet")->first_node("objects");
    ////xml_node<>* controllerNode = controllerSet->first_node();
    ////while (controllerNode != NULL) {
    ////    auto actuators = strToSTLVector<std::string>(controllerNode->first_node("actuator_list")->value());
    ////    controllerNode = controllerNode->next_sibling();
    ////    // Read function as controllerNode->first_node("FunctionSet")
    ////}

    auto loadcontainer = chrono_types::make_shared<ChLoadContainer>();
    system.Add(loadcontainer);

    xml_node<>* forceSet = doc.first_node()->first_node("Model")->first_node("ForceSet");
    if (forceSet != NULL && forceSet->first_node("objects") != NULL) {
        std::cout << forceSet << forceSet->first_node("objects") << std::endl;
        xml_node<>* forceNode = forceSet->first_node("objects")->first_node();
        while (forceNode != NULL) {
            parseForce(forceNode, system, loadcontainer);
            forceNode = forceNode->next_sibling();
        }
    } else {
        std::cout << "No forces detected." << std::endl;
    }

    initShapes(bodyNode, system);
}